

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeMemSetDouble(Mem *pMem,double val)

{
  double y;
  double z;
  
  if ((pMem->flags & 0x2400) == 0) {
    pMem->flags = 1;
  }
  else {
    vdbeMemClearExternAndSetNull(pMem);
  }
  if (!NAN(val)) {
    (pMem->u).r = val;
    pMem->flags = 8;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemSetDouble(Mem *pMem, double val){
  sqlite3VdbeMemSetNull(pMem);
  if( !sqlite3IsNaN(val) ){
    pMem->u.r = val;
    pMem->flags = MEM_Real;
  }
}